

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LazyJSONString.cpp
# Opt level: O0

Var __thiscall Js::LazyJSONString::ReconstructVar(LazyJSONString *this,JSONProperty *prop)

{
  code *pcVar1;
  bool bVar2;
  JSONArray **ppJVar3;
  JavascriptLibrary *pJVar4;
  void **ppvVar5;
  JavascriptString **ppJVar6;
  SListCounted<Js::JSONObjectProperty,_Memory::Recycler> **ppSVar7;
  undefined4 *puVar8;
  JSONProperty *prop_local;
  LazyJSONString *this_local;
  
  switch(prop->type) {
  case Array:
    ppJVar3 = Memory::WriteBarrierPtr::operator_cast_to_JSONArray__
                        ((WriteBarrierPtr *)&(prop->field_1).numericValue);
    this_local = (LazyJSONString *)ReconstructArray(this,*ppJVar3);
    break;
  case Object:
    ppSVar7 = Memory::WriteBarrierPtr::operator_cast_to_SListCounted__
                        ((WriteBarrierPtr *)&(prop->field_1).numericValue);
    this_local = (LazyJSONString *)ReconstructObject(this,*ppSVar7);
    break;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/LazyJSONString.cpp"
                                ,0x96,"((0))","(0)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
    this_local = (LazyJSONString *)0x0;
    break;
  case Null:
    pJVar4 = RecyclableObject::GetLibrary((RecyclableObject *)this);
    this_local = (LazyJSONString *)
                 JavascriptLibraryBase::GetNull(&pJVar4->super_JavascriptLibraryBase);
    break;
  case True:
    pJVar4 = RecyclableObject::GetLibrary((RecyclableObject *)this);
    this_local = (LazyJSONString *)
                 JavascriptLibraryBase::GetTrue(&pJVar4->super_JavascriptLibraryBase);
    break;
  case False:
    pJVar4 = RecyclableObject::GetLibrary((RecyclableObject *)this);
    this_local = (LazyJSONString *)
                 JavascriptLibraryBase::GetFalse(&pJVar4->super_JavascriptLibraryBase);
    break;
  case Number:
    ppvVar5 = Memory::WriteBarrierPtr::operator_cast_to_void__
                        ((WriteBarrierPtr *)&(prop->field_1).numericValue);
    this_local = (LazyJSONString *)*ppvVar5;
    break;
  case String:
    ppJVar6 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptString__
                        ((WriteBarrierPtr *)&(prop->field_1).numericValue);
    this_local = (LazyJSONString *)*ppJVar6;
  }
  return this_local;
}

Assistant:

Var
LazyJSONString::ReconstructVar(_In_ JSONProperty* prop) const
{
    switch (prop->type)
    {
    case JSONContentType::Array:
        return ReconstructArray(prop->arr);
    case JSONContentType::Null:
        return this->GetLibrary()->GetNull();
    case JSONContentType::True:
        return this->GetLibrary()->GetTrue();
    case JSONContentType::False:
        return this->GetLibrary()->GetFalse();
    case JSONContentType::Number:
        return prop->numericValue.value;
    case JSONContentType::String:
        return prop->stringValue;
    case JSONContentType::Object:
        return ReconstructObject(prop->obj);
    default:
        Assume(UNREACHED);
        return nullptr;
    }
}